

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O3

product * get_product(product *__return_storage_ptr__,int id)

{
  JsonRpcException *this;
  product *p;
  string local_38;
  
  if (id == 2) {
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_string_length = 0;
    (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->cat = ord;
    __return_storage_ptr__->id = 2;
    __return_storage_ptr__->price = 55.5;
    std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->name,0,(char *)0x0,0x17a760);
    __return_storage_ptr__->cat = cash_carry;
  }
  else {
    if (id != 1) {
      this = (JsonRpcException *)__cxa_allocate_exception(0x60);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"product not found","");
      jsonrpccxx::JsonRpcException::JsonRpcException(this,-50000,&local_38);
      __cxa_throw(this,&jsonrpccxx::JsonRpcException::typeinfo,
                  jsonrpccxx::JsonRpcException::~JsonRpcException);
    }
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_string_length = 0;
    (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->cat = ord;
    __return_storage_ptr__->id = 1;
    __return_storage_ptr__->price = 22.5;
    std::__cxx11::string::_M_replace((ulong)&__return_storage_ptr__->name,0,(char *)0x0,0x17a753);
    __return_storage_ptr__->cat = ord;
  }
  return __return_storage_ptr__;
}

Assistant:

product get_product(int id) {
  if (id == 1) {
    product p;
    p.id = 1;
    p.price = 22.50;
    p.name = "some product";
    p.cat = category::order;
    return p;
  }
  else if (id == 2) {
    product p;
    p.id = 2;
    p.price = 55.50;
    p.name = "some product 2";
    p.cat = category::cash_carry;
    return p;
  }
  throw JsonRpcException(-50000, "product not found");
}